

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strand_service.hpp
# Opt level: O1

void __thiscall
asio::detail::strand_service::dispatch<std::function<void()>>
          (strand_service *this,implementation_type *impl,function<void_()> *handler)

{
  io_context_impl *owner;
  completion_handler<std::function<void_()>_> *base;
  bool bVar1;
  long *plVar2;
  undefined8 uVar3;
  template_rebind_alloc<completion_handler<function<void_()>_>_> a;
  long in_FS_OFFSET;
  on_dispatch_exit on_exit;
  context ctx;
  ptr local_68;
  on_dispatch_exit local_50;
  implementation_type local_40;
  implementation_type *local_38;
  undefined8 local_30;
  error_code local_28;
  
  plVar2 = *(long **)(in_FS_OFFSET + -8);
  if (plVar2 != (long *)0x0) {
    do {
      if ((implementation_type)*plVar2 == *impl) {
        if (plVar2[1] != 0) {
          if ((handler->super__Function_base)._M_manager != (_Manager_type)0x0) {
            (*handler->_M_invoker)((_Any_data *)handler);
            return;
          }
          std::__throw_bad_function_call();
        }
        break;
      }
      plVar2 = (long *)plVar2[2];
    } while (plVar2 != (long *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + -0x10) == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = *(undefined8 *)(*(long *)(in_FS_OFFSET + -0x10) + 8);
  }
  local_68.h = handler;
  local_68.v = (completion_handler<std::function<void_()>_> *)
               thread_info_base::allocate<asio::detail::thread_info_base::default_tag>(uVar3,0x38);
  ((local_68.v)->super_operation).next_ = (scheduler_operation *)0x0;
  ((local_68.v)->super_operation).func_ = completion_handler<std::function<void_()>_>::do_complete;
  ((local_68.v)->super_operation).task_result_ = 0;
  ((local_68.v)->handler_).super__Function_base._M_manager = (_Manager_type)0x0;
  *(undefined8 *)&((local_68.v)->handler_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&((local_68.v)->handler_).super__Function_base._M_functor + 8) = 0;
  ((local_68.v)->handler_)._M_invoker = handler->_M_invoker;
  if ((handler->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar3 = *(undefined8 *)((long)&(handler->super__Function_base)._M_functor + 8);
    *(undefined8 *)&((local_68.v)->handler_).super__Function_base._M_functor =
         *(undefined8 *)&(handler->super__Function_base)._M_functor;
    *(undefined8 *)((long)&((local_68.v)->handler_).super__Function_base._M_functor + 8) = uVar3;
    ((local_68.v)->handler_).super__Function_base._M_manager =
         (handler->super__Function_base)._M_manager;
    (handler->super__Function_base)._M_manager = (_Manager_type)0x0;
    handler->_M_invoker = (_Invoker_type)0x0;
  }
  local_68.p = local_68.v;
  bVar1 = do_dispatch(this,impl,(operation *)local_68.v);
  base = local_68.p;
  local_68.v = (completion_handler<std::function<void_()>_> *)0x0;
  local_68.p = (completion_handler<std::function<void_()>_> *)0x0;
  if (bVar1) {
    local_40 = *impl;
    local_38 = &local_40;
    local_30 = *(undefined8 *)(in_FS_OFFSET + -8);
    *(implementation_type **)(in_FS_OFFSET + -8) = local_38;
    owner = this->io_context_;
    local_50.impl_ = *impl;
    local_28._M_value = 0;
    local_50.io_context_ = owner;
    local_28._M_cat = (error_category *)std::_V2::system_category();
    completion_handler<std::function<void_()>_>::do_complete
              (owner,&base->super_operation,&local_28,0);
    on_dispatch_exit::~on_dispatch_exit(&local_50);
    *(undefined8 *)(in_FS_OFFSET + -8) = local_30;
  }
  completion_handler<std::function<void_()>_>::ptr::reset(&local_68);
  return;
}

Assistant:

void strand_service::dispatch(strand_service::implementation_type& impl,
    Handler& handler)
{
  // If we are already in the strand then the handler can run immediately.
  if (call_stack<strand_impl>::contains(impl))
  {
    fenced_block b(fenced_block::full);
    asio_handler_invoke_helpers::invoke(handler, handler);
    return;
  }

  // Allocate and construct an operation to wrap the handler.
  typedef completion_handler<Handler> op;
  typename op::ptr p = { asio::detail::addressof(handler),
    op::ptr::allocate(handler), 0 };
  p.p = new (p.v) op(handler);

  ASIO_HANDLER_CREATION((this->context(),
        *p.p, "strand", impl, 0, "dispatch"));

  bool dispatch_immediately = do_dispatch(impl, p.p);
  operation* o = p.p;
  p.v = p.p = 0;

  if (dispatch_immediately)
  {
    // Indicate that this strand is executing on the current thread.
    call_stack<strand_impl>::context ctx(impl);

    // Ensure the next handler, if any, is scheduled on block exit.
    on_dispatch_exit on_exit = { &io_context_, impl };
    (void)on_exit;

    completion_handler<Handler>::do_complete(
        &io_context_, o, asio::error_code(), 0);
  }
}